

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_udata.c
# Opt level: O3

void * lj_lightud_intern(lua_State *L,void *p)

{
  byte bVar1;
  void *p_00;
  GCSize nsz;
  ulong uVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  
  uVar6 = (ulong)(L->glref).ptr32;
  uVar5 = (uint)((ulong)p >> 0x20) & 0xffffff80;
  p_00 = (void *)(ulong)*(uint *)(uVar6 + 0x88);
  bVar1 = *(byte *)(uVar6 + 0x5b);
  if (p_00 == (void *)0x0) {
    uVar2 = (ulong)bVar1;
  }
  else {
    uVar2 = 0;
    do {
      if (*(uint *)((long)p_00 + uVar2 * 4) == uVar5) goto LAB_00117ec1;
      uVar2 = uVar2 + 1;
    } while ((ulong)bVar1 + 1 != uVar2);
    uVar2 = (ulong)bVar1 + 1;
    if (0xfd < bVar1) {
      lj_err_msg(L,LJ_ERR_BADLU);
    }
  }
  iVar4 = (int)uVar2;
  if ((iVar4 != 1) &&
     (uVar3 = iVar4 - ((uint)(uVar2 >> 1) & 0x55),
     uVar3 = (uVar3 >> 2 & 0x33333333) + (uVar3 & 0x33333333),
     ((uVar3 >> 4) + uVar3 & 0xf0f0f0f) * 0x1010101 >> 0x18 < 2)) {
    nsz = 8;
    if (iVar4 != 0) {
      nsz = iVar4 * 8;
    }
    p_00 = lj_mem_realloc(L,p_00,iVar4 * 4,nsz);
    *(int *)(uVar6 + 0x88) = (int)p_00;
  }
  *(char *)(uVar6 + 0x5b) = (char)uVar2;
  *(uint *)((long)p_00 + uVar2 * 4) = uVar5;
LAB_00117ec1:
  return (void *)((ulong)p & 0x7fffffffff | uVar2 << 0x27);
}

Assistant:

void *lj_lightud_intern(lua_State *L, void *p)
{
  global_State *g = G(L);
  uint64_t u = (uint64_t)p;
  uint32_t up = lightudup(u);
  uint32_t *segmap = mref(g->gc.lightudseg, uint32_t);
  MSize segnum = g->gc.lightudnum;
  if (segmap) {
    MSize seg;
    for (seg = 0; seg <= segnum; seg++)
      if (segmap[seg] == up)  /* Fast path. */
	return (void *)(((uint64_t)seg << LJ_LIGHTUD_BITS_LO) | lightudlo(u));
    segnum++;
    /* Leave last segment unused to avoid clash with ITERN key. */
    if (segnum >= (1 << LJ_LIGHTUD_BITS_SEG)-1) lj_err_msg(L, LJ_ERR_BADLU);
  }
  if (!((segnum-1) & segnum) && segnum != 1) {
    lj_mem_reallocvec(L, segmap, segnum, segnum ? 2*segnum : 2u, uint32_t);
    setmref(g->gc.lightudseg, segmap);
  }
  g->gc.lightudnum = segnum;
  segmap[segnum] = up;
  return (void *)(((uint64_t)segnum << LJ_LIGHTUD_BITS_LO) | lightudlo(u));
}